

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTheory.hpp
# Opt level: O0

void __thiscall subsat::BindingsManager::BindingsManager(BindingsManager *this)

{
  vector_map_t<subsat::Var,_subsat::BindingsManager::BindingsRef,_std::allocator<subsat::BindingsManager::BindingsRef>,_subsat::IndexMember<subsat::Var>_>
  *in_RDI;
  vector<std::pair<unsigned_int,_Kernel::TermList>,_std::allocator<std::pair<unsigned_int,_Kernel::TermList>_>_>
  *unaff_retaddr;
  size_type in_stack_ffffffffffffffc8;
  vector_map_t<subsat::Var,_subsat::BindingsManager::BindingsRef,_std::allocator<subsat::BindingsManager::BindingsRef>,_subsat::IndexMember<subsat::Var>_>
  *__n;
  
  __n = in_RDI;
  std::
  vector<std::pair<unsigned_int,_Kernel::TermList>,_std::allocator<std::pair<unsigned_int,_Kernel::TermList>_>_>
  ::vector((vector<std::pair<unsigned_int,_Kernel::TermList>,_std::allocator<std::pair<unsigned_int,_Kernel::TermList>_>_>
            *)0x7b7320);
  vector_map_t<subsat::Var,_subsat::BindingsManager::BindingsRef,_std::allocator<subsat::BindingsManager::BindingsRef>,_subsat::IndexMember<subsat::Var>_>
  ::vector_map_t((vector_map_t<subsat::Var,_subsat::BindingsManager::BindingsRef,_std::allocator<subsat::BindingsManager::BindingsRef>,_subsat::IndexMember<subsat::Var>_>
                  *)0x7b7333);
  vector_map_t<subsat::Var,_subsat::BindingsManager::BindingsRef,_std::allocator<subsat::BindingsManager::BindingsRef>,_subsat::IndexMember<subsat::Var>_>
  ::reserve(in_RDI,in_stack_ffffffffffffffc8);
  std::
  vector<std::pair<unsigned_int,_Kernel::TermList>,_std::allocator<std::pair<unsigned_int,_Kernel::TermList>_>_>
  ::reserve(unaff_retaddr,(size_type)__n);
  return;
}

Assistant:

BindingsManager()
  {
    m_bindings.reserve(32);
    m_bindings_storage.reserve(128);
  }